

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::getExpectedStencilComponentsForTextureLod
               (GLuint pixel_index,GLint cube_face,GLint element_index,GLint n_layers,
               GLint n_mipmap_levels,GLuint *out_components)

{
  GLint local_30;
  byte local_29;
  GLint mipmap_level;
  GLubyte value;
  GLuint *out_components_local;
  GLint local_18;
  GLint n_mipmap_levels_local;
  GLint n_layers_local;
  GLint element_index_local;
  GLint cube_face_local;
  GLuint pixel_index_local;
  
  local_29 = 0;
  local_30 = 0;
  if ((pixel_index & 1) == 1) {
    local_30 = n_mipmap_levels + -1;
  }
  _mipmap_level = out_components;
  out_components_local._4_4_ = n_mipmap_levels;
  local_18 = n_layers;
  n_mipmap_levels_local = element_index;
  n_layers_local = cube_face;
  element_index_local = pixel_index;
  getStencilComponent(cube_face,element_index,local_30,n_layers,n_mipmap_levels,&local_29);
  *_mipmap_level = (uint)local_29;
  return;
}

Assistant:

void getExpectedStencilComponentsForTextureLod(glw::GLuint pixel_index, glw::GLint cube_face, glw::GLint element_index,
											   glw::GLint n_layers, glw::GLint n_mipmap_levels,
											   glw::GLuint* out_components)
{
	glw::GLubyte value		  = 0;
	glw::GLint   mipmap_level = 0;

	if (1 == pixel_index % 2)
	{
		mipmap_level = n_mipmap_levels - 1;
	}

	getStencilComponent(cube_face, element_index, mipmap_level, n_layers, n_mipmap_levels, value);

	out_components[0] = value;
}